

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void enterFullscreenMode(_GLFWwindow *window)

{
  undefined1 local_1b8 [8];
  GLFWvidmode mode;
  XEvent event;
  XEvent event_1;
  int y;
  int x;
  unsigned_long value;
  _GLFWwindow *window_local;
  
  value = (unsigned_long)window;
  if (_glfw.x11.saver.count == 0) {
    XGetScreenSaver(_glfw.x11.display,0x11a76c,0x11a770,0x11a774,0x11a778);
    XSetScreenSaver(_glfw.x11.display,0,0,0,2);
  }
  _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  _glfwSetVideoMode(*(_GLFWmonitor **)(value + 0x30),(GLFWvidmode *)(value + 0x18));
  if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR != 0) {
    _y = 1;
    XChangeProperty(_glfw.x11.display,*(undefined8 *)(value + 0x250),
                    _glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20,0,&y,1);
  }
  if ((_glfw.x11.NET_WM_STATE == 0) || (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0)) {
    if (*(char *)(value + 600) != '\0') {
      _glfwPlatformGetVideoMode(*(_GLFWmonitor **)(value + 0x30),(GLFWvidmode *)local_1b8);
      XRaiseWindow(_glfw.x11.display,*(undefined8 *)(value + 0x250));
      XSetInputFocus(_glfw.x11.display,*(undefined8 *)(value + 0x250),2,0);
      XMoveWindow(_glfw.x11.display,*(undefined8 *)(value + 0x250),0);
      XResizeWindow(_glfw.x11.display,*(undefined8 *)(value + 0x250),local_1b8._0_4_,local_1b8._4_4_
                   );
    }
  }
  else {
    _glfwPlatformGetMonitorPos
              (*(_GLFWmonitor **)(value + 0x30),(int *)((long)&event_1 + 0xbc),
               (int *)(event_1.pad + 0x17));
    _glfwPlatformSetWindowPos((_GLFWwindow *)value,event_1.pad[0x17]._4_4_,event_1.pad[0x17]._0_4_);
    if (_glfw.x11.NET_ACTIVE_WINDOW != 0) {
      memset(event.pad + 0x17,0,0xc0);
      event.pad[0x17]._0_4_ = 0x21;
      event_1.xany.display = (Display *)*(undefined8 *)(value + 0x250);
      event_1.xfocus.mode = 0x20;
      event_1.xany.window = _glfw.x11.NET_ACTIVE_WINDOW;
      event_1.xkey.subwindow = 1;
      event_1.xkey.time = 0;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,event.pad + 0x17);
    }
    memset(&mode.blueBits,0,0xc0);
    mode.blueBits = 0x21;
    event.xany.display = (Display *)*(undefined8 *)(value + 0x250);
    event.xfocus.mode = 0x20;
    event.xany.window = _glfw.x11.NET_WM_STATE;
    event.xkey.subwindow = 1;
    event.xselectionrequest.target = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    event.xselectionrequest.property = 0;
    event.xconfigure.above = 1;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&mode.blueBits);
  }
  return;
}

Assistant:

static void enterFullscreenMode(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    _glfw.x11.saver.count++;

    _glfwSetVideoMode(window->monitor, &window->videoMode);

    if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR)
    {
        const unsigned long value = 1;

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                        PropModeReplace, (unsigned char*) &value, 1);
    }

    if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
    {
        int x, y;
        _glfwPlatformGetMonitorPos(window->monitor, &x, &y);
        _glfwPlatformSetWindowPos(window, x, y);

        if (_glfw.x11.NET_ACTIVE_WINDOW)
        {
            // Ask the window manager to raise and focus the GLFW window
            // Only focused windows with the _NET_WM_STATE_FULLSCREEN state end
            // up on top of all other windows ("Stacking order" in EWMH spec)

            XEvent event;
            memset(&event, 0, sizeof(event));

            event.type = ClientMessage;
            event.xclient.window = window->x11.handle;
            event.xclient.format = 32; // Data is 32-bit longs
            event.xclient.message_type = _glfw.x11.NET_ACTIVE_WINDOW;
            event.xclient.data.l[0] = 1; // Sender is a normal application
            event.xclient.data.l[1] = 0; // We don't really know the timestamp

            XSendEvent(_glfw.x11.display,
                       _glfw.x11.root,
                       False,
                       SubstructureNotifyMask | SubstructureRedirectMask,
                       &event);
        }

        // Ask the window manager to make the GLFW window a fullscreen window
        // Fullscreen windows are undecorated and, when focused, are kept
        // on top of all other windows

        XEvent event;
        memset(&event, 0, sizeof(event));

        event.type = ClientMessage;
        event.xclient.window = window->x11.handle;
        event.xclient.format = 32; // Data is 32-bit longs
        event.xclient.message_type = _glfw.x11.NET_WM_STATE;
        event.xclient.data.l[0] = _NET_WM_STATE_ADD;
        event.xclient.data.l[1] = _glfw.x11.NET_WM_STATE_FULLSCREEN;
        event.xclient.data.l[2] = 0; // No secondary property
        event.xclient.data.l[3] = 1; // Sender is a normal application

        XSendEvent(_glfw.x11.display,
                   _glfw.x11.root,
                   False,
                   SubstructureNotifyMask | SubstructureRedirectMask,
                   &event);
    }
    else if (window->x11.overrideRedirect)
    {
        // In override-redirect mode we have divorced ourselves from the
        // window manager, so we need to do everything manually

        GLFWvidmode mode;
        _glfwPlatformGetVideoMode(window->monitor, &mode);

        XRaiseWindow(_glfw.x11.display, window->x11.handle);
        XSetInputFocus(_glfw.x11.display, window->x11.handle,
                       RevertToParent, CurrentTime);
        XMoveWindow(_glfw.x11.display, window->x11.handle, 0, 0);
        XResizeWindow(_glfw.x11.display, window->x11.handle,
                      mode.width, mode.height);
    }
}